

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O2

int Pla_ManDist1Num(Pla_Man_t *p)

{
  int iVar1;
  int iVar2;
  word *pwVar3;
  word *pwVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int i;
  int i_00;
  int iVar9;
  bool bVar10;
  
  iVar2 = (p->vCubes).nSize;
  i = 0;
  iVar9 = 0;
  do {
    if (iVar2 <= i) {
      return iVar9;
    }
    pwVar3 = Pla_CubeIn(p,i);
    i = i + 1;
    for (i_00 = i; iVar2 = (p->vCubes).nSize, i_00 < iVar2; i_00 = i_00 + 1) {
      pwVar4 = Pla_CubeIn(p,i_00);
      uVar6 = 0;
      uVar5 = (ulong)(uint)p->nInWords;
      if (p->nInWords < 1) {
        uVar5 = uVar6;
      }
      iVar2 = 0;
      for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        iVar1 = iVar2;
        if ((pwVar3[uVar6] != pwVar4[uVar6]) &&
           ((bVar10 = iVar2 != 0, iVar2 = 0, bVar10 ||
            (uVar7 = pwVar4[uVar6] ^ pwVar3[uVar6],
            uVar8 = (uVar7 >> 1 | uVar7) & 0x5555555555555555, uVar7 = uVar8 - 1, iVar1 = 1,
            (uVar8 ^ uVar7) <= uVar7)))) break;
        iVar2 = iVar1;
      }
      iVar9 = iVar9 + iVar2;
    }
  } while( true );
}

Assistant:

int Pla_ManDist1Num( Pla_Man_t * p )
{
    word * pCube1, * pCube2; 
    int i, k, Dist, Count = 0;
    Pla_ForEachCubeIn( p, pCube1, i )
    Pla_ForEachCubeInStart( p, pCube2, k, i+1 )
    {
        Dist = Pla_CubesAreDistance1( pCube1, pCube2, p->nInWords );
//        Dist = Pla_CubesAreConsensus( pCube1, pCube2, p->nInWords, NULL );
        Count += (Dist == 1);
    }
    return Count;
}